

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

void __thiscall Fossilize::DatabaseInterface::~DatabaseInterface(DatabaseInterface *this)

{
  pointer ppEVar1;
  pointer puVar2;
  DatabaseInterface *pDVar3;
  _Head_base<0UL,_Fossilize::DatabaseInterface_*,_false> _Var4;
  pointer *__ptr;
  Impl *pIVar5;
  long lVar6;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_004b1760;
  pIVar5 = this->impl;
  if (pIVar5->mapped_metadata != (uint8_t *)0x0) {
    munmap(pIVar5->mapped_metadata,pIVar5->mapped_metadata_size);
    pIVar5 = this->impl;
    if (pIVar5 == (Impl *)0x0) {
      pIVar5 = (Impl *)0x0;
      goto LAB_00169e03;
    }
  }
  ppEVar1 = (pIVar5->imported_metadata).
            super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)(pIVar5->imported_metadata).
                                  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar1
                   );
  }
  lVar6 = 0x220;
  do {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)((long)pIVar5->implicit_whitelisted + lVar6 + -0x28));
    lVar6 = lVar6 + -0x38;
  } while (lVar6 != -0x10);
  puVar2 = (pIVar5->sub_databases_in_whitelist).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(pIVar5->sub_databases_in_whitelist).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  pDVar3 = (pIVar5->blacklist)._M_t.
           super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
           .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (pDVar3 != (DatabaseInterface *)0x0) {
    (*pDVar3->_vptr_DatabaseInterface[1])();
  }
  (pIVar5->blacklist)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
  _Var4._M_head_impl =
       (pIVar5->whitelist)._M_t.
       super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
       ._M_t.
       super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
       .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (DatabaseInterface *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_DatabaseInterface + 8))();
  }
  (pIVar5->whitelist)._M_t.
  super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
  .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl =
       (DatabaseInterface *)0x0;
LAB_00169e03:
  operator_delete(pIVar5,0x290);
  return;
}

Assistant:

DatabaseInterface::~DatabaseInterface()
{
#ifdef _WIN32
	if (impl->mapped_metadata)
		UnmapViewOfFile(impl->mapped_metadata);
#else
	if (impl->mapped_metadata)
		munmap(const_cast<uint8_t *>(impl->mapped_metadata), impl->mapped_metadata_size);
#endif
	delete impl;
}